

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate1<double>::apply
          (QGate1<double> *this,Op op,int nbQubits,vector<double,_std::allocator<double>_> *vector,
          int offset)

{
  int iVar1;
  double *vector_00;
  SquareMatrix<double> local_60;
  undefined1 local_50 [8];
  anon_class_40_5_d6c92a71 f;
  int qubit;
  int offset_local;
  vector<double,_std::allocator<double>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  QGate1<double> *this_local;
  
  f.m22._4_4_ = offset;
  iVar1 = (*(this->super_QObject<double>)._vptr_QObject[3])();
  f.m22._0_4_ = iVar1 + f.m22._4_4_;
  (*(this->super_QObject<double>)._vptr_QObject[7])();
  vector_00 = std::vector<double,_std::allocator<double>_>::data(vector);
  lambda_QGate1<double>((anon_class_40_5_d6c92a71 *)local_50,op,&local_60,vector_00);
  dense::SquareMatrix<double>::~SquareMatrix(&local_60);
  apply2<qclab::qgates::lambda_QGate1<double>(qclab::Op,qclab::dense::SquareMatrix<double>,double*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,f.m22._0_4_,(anon_class_40_5_d6c92a71 *)local_50);
  return;
}

Assistant:

void QGate1< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_QGate1( op , this->matrix() , vector.data() ) ;
    apply2( nbQubits , qubit , f ) ;
  }